

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_Error FT_Stream_EnterFrame(FT_Stream stream,FT_ULong count)

{
  ulong uVar1;
  FT_Memory pFVar2;
  ulong uVar3;
  uchar *puVar4;
  unsigned_long uVar5;
  int iVar6;
  
  uVar1 = stream->size;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    uVar3 = stream->pos;
    iVar6 = 0x55;
    if (count <= uVar1 - uVar3 && uVar3 < uVar1) {
      stream->cursor = stream->base + uVar3;
      stream->limit = stream->base + uVar3 + count;
      stream->pos = uVar3 + count;
      iVar6 = 0;
    }
  }
  else {
    iVar6 = 0x55;
    if (count <= uVar1) {
      pFVar2 = stream->memory;
      if ((long)count < 1) {
        puVar4 = (uchar *)0x0;
        iVar6 = 6;
        if (count == 0) {
          iVar6 = 0;
        }
      }
      else {
        puVar4 = (uchar *)(*pFVar2->alloc)(pFVar2,count);
        iVar6 = (uint)(puVar4 == (uchar *)0x0) << 6;
      }
      stream->base = puVar4;
      if (iVar6 == 0) {
        uVar5 = (*stream->read)(stream,stream->pos,puVar4,count);
        if (uVar5 < count) {
          if (stream->base != (uchar *)0x0) {
            (*pFVar2->free)(pFVar2,stream->base);
          }
          stream->base = (uchar *)0x0;
          iVar6 = 0x55;
        }
        stream->cursor = stream->base;
        stream->limit = stream->base + count;
        stream->pos = stream->pos + uVar5;
      }
    }
  }
  return iVar6;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_EnterFrame( FT_Stream  stream,
                        FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    /* check for nested frame access */
    FT_ASSERT( stream && stream->cursor == 0 );

    if ( stream->read )
    {
      /* allocate the frame in memory */
      FT_Memory  memory = stream->memory;


      /* simple sanity check */
      if ( count > stream->size )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " frame size (%lu) larger than stream size (%lu)\n",
                   count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

#ifdef FT_DEBUG_MEMORY
      /* assume _ft_debug_file and _ft_debug_lineno are already set */
      stream->base = (unsigned char*)ft_mem_qalloc( memory,
                                                    (FT_Long)count,
                                                    &error );
      if ( error )
        goto Exit;
#else
      if ( FT_QALLOC( stream->base, count ) )
        goto Exit;
#endif
      /* read it */
      read_bytes = stream->read( stream, stream->pos,
                                 stream->base, count );
      if ( read_bytes < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid read; expected %lu bytes, got %lu\n",
                   count, read_bytes ));

        FT_FREE( stream->base );
        error = FT_THROW( Invalid_Stream_Operation );
      }
      stream->cursor = stream->base;
      stream->limit  = stream->cursor + count;
      stream->pos   += read_bytes;
    }
    else
    {
      /* check current and new position */
      if ( stream->pos >= stream->size        ||
           stream->size - stream->pos < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid i/o; pos = 0x%lx, count = %lu, size = 0x%lx\n",
                   stream->pos, count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

      /* set cursor */
      stream->cursor = stream->base + stream->pos;
      stream->limit  = stream->cursor + count;
      stream->pos   += count;
    }

  Exit:
    return error;
  }